

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_AliasBool_Test::ClCommandLine_AliasBool_Test(ClCommandLine_AliasBool_Test *this)

{
  ClCommandLine_AliasBool_Test *this_local;
  
  anon_unknown.dwarf_19dfa::ClCommandLine::ClCommandLine(&this->super_ClCommandLine);
  (this->super_ClCommandLine).super_Test._vptr_Test =
       (_func_int **)&PTR__ClCommandLine_AliasBool_Test_00245408;
  return;
}

Assistant:

TEST_F (ClCommandLine, AliasBool) {
    opt<bool> opt{"opt"};
    alias opt2{"o", aliasopt{opt}};

    this->add ("progname", "-o");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_TRUE (res);
    EXPECT_EQ (errors.str ().length (), 0U);
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (opt.get_num_occurrences (), 1U);
    EXPECT_EQ (opt.get (), true);
    EXPECT_EQ (opt2.get_num_occurrences (), 1U);
}